

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_gtest_tests.cpp
# Opt level: O3

void __thiscall
test::syntax_gtest_tests::iu_GTestSyntaxTest_x_iutest_x_Null_Test::Body
          (iu_GTestSyntaxTest_x_iutest_x_Null_Test *this)

{
  return;
}

Assistant:

TEST(GTestSyntaxTest, Null)
{
    int* p = NULL;
    if( int x = 1 )
        ASSERT_NULL(p) << x;
    if( int x = 1 )
        EXPECT_NULL(p) << x;
    if( int x = 1 )
        INFORM_NULL(p) << x;
    if( int x = 1 )
        ASSUME_NULL(p) << x;
}